

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

bool __thiscall
flatbuffers::AnnotatedBinaryTextGenerator::Generate
          (AnnotatedBinaryTextGenerator *this,string *filename,string *schema_filename,
          string *output_filename)

{
  long lVar1;
  _Base_ptr p_Var2;
  size_type sVar3;
  BinaryRegion *region_00;
  char cVar4;
  undefined3 uVar5;
  pointer pBVar6;
  pointer filepath;
  ostream *poVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  size_type *psVar10;
  BinaryRegion *extraout_RDX;
  BinaryRegion *extraout_RDX_00;
  BinaryRegion *extraout_RDX_01;
  BinaryRegion *extraout_RDX_02;
  AnnotatedBinaryTextGenerator *pAVar11;
  BinaryRegion *region;
  pointer pcVar12;
  _Base_ptr p_Var13;
  OutputConfig *in_R8;
  OutputConfig *in_R9;
  pointer pcVar14;
  undefined1 auVar15 [16];
  string out;
  OutputConfig output_config;
  ofstream ofs;
  string local_2e8;
  AnnotatedBinaryTextGenerator *local_2c8;
  _Base_ptr local_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  undefined1 local_298 [40];
  pointer local_270;
  pointer local_268;
  pointer local_260;
  _Rb_tree_node_base *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  pointer local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_298._8_8_ = (pointer)0x14;
  local_298._16_8_ = (this->options_).max_bytes_per_line;
  local_298[0x21] = (this->options_).include_vector_contents;
  local_298[0x20] = 0x7c;
  lVar1 = this->binary_length_;
  local_298._24_8_ = 8;
  if ((lVar1 < 0x1000000) && (local_298._24_8_ = 6, lVar1 < 0x10000)) {
    local_298._24_8_ = (ulong)(0xff < lVar1) * 2 + 2;
  }
  local_298._0_8_ = (pointer)0x0;
  p_Var9 = (this->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2c0 = &(this->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2c8 = this;
  local_270 = (pointer)schema_filename;
  local_268 = (pointer)output_filename;
  local_260 = (pointer)filename;
  if (p_Var9 != local_2c0) {
    pcVar12 = (pointer)0x0;
    pcVar14 = (pointer)0x14;
    do {
      p_Var2 = p_Var9[2]._M_right;
      local_258 = p_Var9;
      for (p_Var13 = p_Var9[2]._M_left; p_Var13 != p_Var2; p_Var13 = p_Var13 + 5) {
        (anonymous_namespace)::GenerateTypeString_abi_cxx11_
                  ((string *)local_230,(_anonymous_namespace_ *)p_Var13,
                   (BinaryRegion *)schema_filename);
        if (pcVar12 < local_228) {
          pcVar12 = local_228;
        }
        schema_filename = (string *)extraout_RDX;
        local_298._0_8_ = pcVar12;
        if (p_Var13->_M_right == (_Base_ptr)0x0) {
          (anonymous_namespace)::ToValueString_abi_cxx11_
                    (&local_2e8,(_anonymous_namespace_ *)p_Var13,(BinaryRegion *)local_2c8->binary_,
                     local_298,in_R8);
          std::__cxx11::string::operator=((string *)local_230,(string *)&local_2e8);
          schema_filename = (string *)extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
            schema_filename = (string *)extraout_RDX_01;
          }
          local_298._8_8_ = pcVar14;
          if (pcVar14 < local_228) {
            pcVar14 = local_228;
            local_298._8_8_ = local_228;
          }
        }
        if (local_230 != (undefined1  [8])local_220) {
          operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
          schema_filename = (string *)extraout_RDX_02;
        }
      }
      auVar15 = std::_Rb_tree_increment(local_258);
      schema_filename = auVar15._8_8_;
      p_Var9 = auVar15._0_8_;
    } while (p_Var9 != local_2c0);
  }
  local_2b8 = local_2a8;
  pcVar12 = ((_Alloc_hider *)&local_268->offset)->_M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar12,pcVar12 + local_268->length);
  filepath = local_260;
  if (local_2b0 == 0) {
    StripExtension((string *)local_230,(string *)local_260);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_230);
    pAVar11 = local_2c8;
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append
              ((char *)&local_2b8,(ulong)(pAVar11->options_).output_postfix._M_dataplus._M_p);
    sVar3 = (pAVar11->options_).output_extension._M_string_length;
    if (sVar3 == 0) {
      GetExtension(&local_2e8,(string *)filepath);
    }
    else {
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      pcVar12 = (pAVar11->options_).output_extension._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2e8,pcVar12,pcVar12 + sVar3);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   ".",&local_2e8);
    std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_230);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
  }
  std::ofstream::ofstream(local_230,(char *)local_2b8,_S_out);
  pBVar6 = local_270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,"// Annotated Flatbuffer Binary",0x1e);
  pAVar11 = local_2c8;
  std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"//",2);
  std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  if (pBVar6->length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"// Schema file: ",0x10)
    ;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,((_Alloc_hider *)&pBVar6->offset)->_M_p,pBVar6->length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"// Binary file: ",0x10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_230,((_Alloc_hider *)&filepath->offset)->_M_p,
                      filepath->length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  p_Var9 = (pAVar11->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var9 != local_2c0) {
    do {
      region_00 = (BinaryRegion *)pAVar11->binary_;
      cVar4 = (char)(ostream *)local_230;
      std::ios::widen((char)*(undefined8 *)((long)local_230 + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      uVar5 = local_2e8.field_2._M_allocated_capacity._5_3_;
      switch(*(undefined4 *)&p_Var9[2]._M_parent) {
      case 0:
        local_2e8.field_2._M_allocated_capacity = 0x6e776f6e6b6e75;
        goto LAB_0032184d;
      case 1:
        local_2e8.field_2._M_allocated_capacity._0_6_ = 0x726500000000;
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x64616568;
        goto LAB_00321901;
      case 2:
        local_2e8.field_2._M_allocated_capacity._0_5_ = 0x6500000000;
        local_2e8.field_2._M_allocated_capacity =
             CONCAT35(uVar5,local_2e8.field_2._M_allocated_capacity._0_5_);
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x6c626174;
        goto LAB_0032194c;
      case 3:
        local_2e8.field_2._M_allocated_capacity = 0x6261745f746f6f72;
        local_2e8._M_string_length = 10;
        local_2e8.field_2._8_3_ = 0x656c;
        break;
      case 4:
        local_2e8.field_2._M_allocated_capacity._0_6_ = 0x656c00000000;
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x62617476;
        goto LAB_00321901;
      case 5:
        local_2e8.field_2._M_allocated_capacity._0_6_ = 0x746300000000;
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x75727473;
        goto LAB_00321901;
      case 6:
        local_2e8.field_2._M_allocated_capacity._0_6_ = 0x676e00000000;
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x69727473;
        goto LAB_00321901;
      case 7:
        local_2e8.field_2._M_allocated_capacity._0_6_ = 0x726f00000000;
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x74636576;
LAB_00321901:
        local_2e8._M_string_length = 6;
        local_2e8.field_2._M_local_buf[6] = 0;
        break;
      case 8:
        local_2e8.field_2._M_allocated_capacity._0_5_ = 0x6e00000000;
        local_2e8.field_2._M_allocated_capacity =
             CONCAT35(uVar5,local_2e8.field_2._M_allocated_capacity._0_5_);
        local_2e8.field_2._M_allocated_capacity._0_4_ = 0x6f696e75;
LAB_0032194c:
        local_2e8._M_string_length = 5;
        local_2e8.field_2._M_local_buf[5] = 0;
        break;
      case 9:
        local_2e8.field_2._M_allocated_capacity = 0x676e6964646170;
LAB_0032184d:
        local_2e8._M_string_length = 7;
        break;
      case 10:
        local_2e8.field_2._M_allocated_capacity = 0x3436726f74636576;
        local_2e8._M_string_length = 8;
        local_2e8.field_2._8_8_ = local_2e8.field_2._8_8_ & 0xffffffffffffff00;
        break;
      default:
        local_2e8._M_string_length = 4;
        local_2e8.field_2._M_allocated_capacity._0_5_ = 0x6f646f74;
        local_2e8.field_2._M_allocated_capacity =
             CONCAT35(uVar5,local_2e8.field_2._M_allocated_capacity._0_5_);
      }
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (p_Var9[1]._M_left != (_Base_ptr)0x0) {
        std::operator+(&local_250," (",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var9[1]._M_parent);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_2e8.field_2._M_allocated_capacity = *psVar10;
          local_2e8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar10;
          local_2e8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2e8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,":",1);
      if ((((*(int *)&p_Var9[2]._M_parent == 10) || (*(int *)&p_Var9[2]._M_parent == 7)) &&
          (local_298[0x21] == Unknown >> 8)) &&
         (4 < (ulong)(((long)p_Var9[2]._M_right - (long)p_Var9[2]._M_left >> 5) *
                     -0x3333333333333333))) {
        anon_unknown_7::GenerateRegion
                  ((anon_unknown_7 *)local_230,(ostream *)p_Var9[2]._M_left,region_00,
                   (BinarySection *)local_298,(uint8_t *)in_R8,in_R9);
        anon_unknown_7::GenerateRegion
                  ((anon_unknown_7 *)local_230,(ostream *)(p_Var9[2]._M_left + 5),region_00,
                   (BinarySection *)local_298,(uint8_t *)in_R8,in_R9);
        std::ios::widen((char)*(undefined8 *)((long)local_230 + -0x18) + cVar4);
        std::ostream::put(cVar4);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  <",3);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," regions omitted>",0x11);
        anon_unknown_7::GenerateRegion
                  ((anon_unknown_7 *)local_230,(ostream *)(p_Var9[2]._M_right + -5),region_00,
                   (BinarySection *)local_298,(uint8_t *)in_R8,in_R9);
      }
      else {
        p_Var2 = p_Var9[2]._M_right;
        for (p_Var13 = p_Var9[2]._M_left; p_Var13 != p_Var2; p_Var13 = p_Var13 + 5) {
          anon_unknown_7::GenerateRegion
                    ((anon_unknown_7 *)local_230,(ostream *)p_Var13,region_00,
                     (BinarySection *)local_298,(uint8_t *)in_R8,in_R9);
        }
      }
      std::ios::widen((char)*(undefined8 *)((long)local_230 + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      pAVar11 = local_2c8;
    } while (p_Var9 != local_2c0);
  }
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _strtof_l;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  return true;
}

Assistant:

bool AnnotatedBinaryTextGenerator::Generate(
    const std::string &filename, const std::string &schema_filename,
    const std::string &output_filename) {
  OutputConfig output_config;
  output_config.max_bytes_per_line = options_.max_bytes_per_line;
  output_config.include_vector_contents = options_.include_vector_contents;

  // Given the length of the binary, we can calculate the maximum number of
  // characters to display in the offset hex: (i.e. 2 would lead to 0XFF being
  // the max output).
  output_config.offset_max_char =
      binary_length_ > 0xFFFFFF
          ? 8
          : (binary_length_ > 0xFFFF ? 6 : (binary_length_ > 0xFF ? 4 : 2));

  // Find the largest type string of all the regions in this file, so we can
  // align the output nicely.
  output_config.largest_type_string = 0;
  for (const auto &section : annotations_) {
    for (const auto &region : section.second.regions) {
      std::string s = GenerateTypeString(region);
      if (s.size() > output_config.largest_type_string) {
        output_config.largest_type_string = s.size();
      }

      // Don't consider array regions, as they will be split to multiple lines.
      if (!region.array_length) {
        s = ToValueString(region, binary_, output_config);
        if (s.size() > output_config.largest_value_string) {
          output_config.largest_value_string = s.size();
        }
      }
    }
  }

  std::string out = output_filename;
  if (out.empty()) {
    // Modify the output filename.
    out = StripExtension(filename);
    out += options_.output_postfix;
    out +=
        "." + (options_.output_extension.empty() ? GetExtension(filename)
                                                 : options_.output_extension);
  }

  std::ofstream ofs(out.c_str());

  ofs << "// Annotated Flatbuffer Binary" << std::endl;
  ofs << "//" << std::endl;
  if (!schema_filename.empty()) {
    ofs << "// Schema file: " << schema_filename << std::endl;
  }
  ofs << "// Binary file: " << filename << std::endl;

  // Generate each of the binary sections
  for (const auto &section : annotations_) {
    GenerateSection(ofs, section.second, binary_, output_config);
  }

  ofs.close();
  return true;
}